

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utext.cpp
# Opt level: O3

void unistrTextClose(UText *ut)

{
  if ((ut->providerProperties & 0x20) != 0) {
    if ((long *)ut->context != (long *)0x0) {
      (**(code **)(*ut->context + 8))();
    }
    ut->context = (void *)0x0;
  }
  return;
}

Assistant:

static void U_CALLCONV
unistrTextClose(UText *ut) {
    // Most of the work of close is done by the generic UText framework close.
    // All that needs to be done here is delete the UnicodeString if the UText
    //  owns it.  This occurs if the UText was created by cloning.
    if (ut->providerProperties & I32_FLAG(UTEXT_PROVIDER_OWNS_TEXT)) {
        UnicodeString *str = (UnicodeString *)ut->context;
        delete str;
        ut->context = NULL;
    }
}